

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_scan_root_p_tree_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  int iVar1;
  bsc_step_t bVar2;
  long lVar3;
  double dVar4;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  dVar4 = (double)iVar1;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = ceil(dVar4);
  bVar2 = depends;
  if (0 < n) {
    lVar3 = 0;
    do {
      bVar2 = bsc_scan_qtree_single
                        (depends,group,*(void **)((long)&params->src + lVar3),
                         *(void **)((long)&params->dst + lVar3),
                         *(void **)((long)&params->tmp + lVar3),
                         *(bsc_reduce_t *)((long)&params->reducer + lVar3),
                         *(void **)((long)&params->zero + lVar3),
                         *(bsc_size_t *)((long)&params->nmemb + lVar3),
                         *(bsc_size_t *)((long)&params->size + lVar3),(int)dVar4);
      lVar3 = lVar3 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar3);
  }
  return bVar2;
}

Assistant:

bsc_step_t bsc_scan_root_p_tree_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_P = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_scan_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, root_P );
    }

    return finished;
}